

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_ignoreOtherParametersMultipleCallsButOneDidntHappen_Test::
TEST_MockParameterTest_ignoreOtherParametersMultipleCallsButOneDidntHappen_Test
          (TEST_MockParameterTest_ignoreOtherParametersMultipleCallsButOneDidntHappen_Test *this)

{
  TEST_MockParameterTest_ignoreOtherParametersMultipleCallsButOneDidntHappen_Test *this_local;
  
  memset(this,0,8);
  TEST_GROUP_CppUTestGroupMockParameterTest::TEST_GROUP_CppUTestGroupMockParameterTest
            (&this->super_TEST_GROUP_CppUTestGroupMockParameterTest);
  (this->super_TEST_GROUP_CppUTestGroupMockParameterTest).super_Utest._vptr_Utest =
       (_func_int **)
       &
       PTR__TEST_MockParameterTest_ignoreOtherParametersMultipleCallsButOneDidntHappen_Test_00359568
  ;
  return;
}

Assistant:

TEST(MockParameterTest, ignoreOtherParametersMultipleCallsButOneDidntHappen)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    MockCheckedExpectedCall* call = expectations.addFunction("boo");
    call->ignoreOtherParameters();
    call->callWasMade(1);
    call->finalizeActualCallMatch();
    call->ignoreOtherParameters();
    expectations.addFunction("boo")->ignoreOtherParameters();
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock().expectOneCall("boo").ignoreOtherParameters();
    mock().expectOneCall("boo").ignoreOtherParameters();
    mock().actualCall("boo");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}